

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (key == 0x46) {
    if (action != 0) {
      Auto_strech = (bool)((Auto_strech ^ 0xffU) & 1);
      if (Auto_strech == false) {
        glfwSetWindowSize(window,SizeX_saved_global,SizeY_saved_global);
        glfwSetWindowPos(window,PosX_saved_global,PosY_saved_global);
      }
      else {
        glfwGetWindowPos(window,&PosX_saved_global,&PosY_saved_global);
        glfwGetWindowSize(window,&SizeX_saved_global,&SizeY_saved_global);
        glfwSetWindowSize(window,VideoMode_global->width,VideoMode_global->height);
        glfwSetWindowPos(window,0,0);
      }
    }
  }
  else if (key == 0x51) {
    glfwSetWindowShouldClose(window,1);
  }
  else if (key == 0x100) {
    glfwSetWindowShouldClose(window,1);
  }
  else if (key == 0x106) {
    Translation[0] = Translation[0] + 1.0;
  }
  else if (key == 0x107) {
    Translation[0] = Translation[0] - 1.0;
  }
  else if (key == 0x108) {
    Translation[1] = Translation[1] - 1.0;
  }
  else if (key == 0x109) {
    Translation[1] = Translation[1] + 1.0;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    switch (key) {
                    
        // Hint on making up/down left/right work: the variable Translation [0] and [1].
                
        case GLFW_KEY_ESCAPE: 
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break; 
        case GLFW_KEY_Q:      
            glfwSetWindowShouldClose(window, GLFW_TRUE); 
            break;
        case GLFW_KEY_LEFT :
            Translation[0]-=1.0f;
            break;
        case GLFW_KEY_RIGHT:
            Translation[0]+=1.0f;
            break;
        case GLFW_KEY_UP   :
            Translation[1]+=1.0f;
            break;
        case GLFW_KEY_DOWN :
            Translation[1]-=1.0f;
            break;
        case GLFW_KEY_F:
            if (action) {
                Auto_strech = !Auto_strech;                 
                if (Auto_strech){
                    glfwGetWindowPos(window, &PosX_saved_global, &PosY_saved_global);
                    glfwGetWindowSize(window, &SizeX_saved_global, &SizeY_saved_global);
                    glfwSetWindowSize(window, VideoMode_global->width, VideoMode_global->height);
                    glfwSetWindowPos(window, 0, 0);
                }else{
                    glfwSetWindowSize(window, SizeX_saved_global, SizeY_saved_global);
                    glfwSetWindowPos(window, PosX_saved_global, PosY_saved_global);
                }
            }
            break;
        default: 
            break;
    }
    
}